

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Tracks::~Tracks(Tracks *this)

{
  long *plVar1;
  long *in_RDI;
  Track *track;
  uint32_t i;
  uint local_c;
  
  if (*in_RDI != 0) {
    for (local_c = 0; local_c < *(uint *)(in_RDI + 1); local_c = local_c + 1) {
      plVar1 = *(long **)(*in_RDI + (ulong)local_c * 8);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete__((void *)*in_RDI);
    }
  }
  return;
}

Assistant:

Tracks::~Tracks() {
  if (track_entries_) {
    for (uint32_t i = 0; i < track_entries_size_; ++i) {
      Track* const track = track_entries_[i];
      delete track;
    }
    delete[] track_entries_;
  }
}